

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_num_places(void)

{
  undefined4 local_4;
  
  if (__kmp_affin_mask_size == 0) {
    local_4 = 0;
  }
  else {
    local_4 = __kmp_affinity_num_masks;
  }
  return local_4;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_num_places(void) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  return __kmp_affinity_num_masks;
#endif
}